

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserInterface.cpp
# Opt level: O1

void __thiscall
DropdownMenu::DropdownMenu(DropdownMenu *this,TextButton *button,Color *backgroundColor)

{
  Transformable *this_00;
  RectangleShape *this_01;
  Vector2f VVar1;
  Vector2f VVar2;
  Vector2f VVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  Font *pFVar11;
  Uint64 UVar12;
  Uint32 UVar13;
  Color CVar14;
  Color CVar15;
  uint uVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined7 uVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  Vector2f *pVVar29;
  Vector2f local_38;
  
  (this->super_UIComponent).super_Drawable._vptr_Drawable = (_func_int **)&PTR__Drawable_001d19b0;
  this_00 = &(this->super_UIComponent).super_Transformable;
  sf::Transformable::Transformable(this_00);
  (this->super_UIComponent).super_Transformable.field_0xa9 = 1;
  (this->super_UIComponent).super_Drawable._vptr_Drawable =
       (_func_int **)&PTR__DropdownMenu_001d2178;
  (this->super_UIComponent).super_Transformable._vptr_Transformable =
       (_func_int **)&PTR__DropdownMenu_001d21b0;
  TextButton::TextButton(&this->button);
  this_01 = &this->background;
  local_38.x = 0.0;
  local_38.y = 0.0;
  sf::RectangleShape::RectangleShape(this_01,&local_38);
  (this->menuButtons).super__Vector_base<TextButton,_std::allocator<TextButton>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->menuButtons).super__Vector_base<TextButton,_std::allocator<TextButton>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->menuButtons).super__Vector_base<TextButton,_std::allocator<TextButton>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  VVar1 = (button->super_UIComponent).super_Transformable.m_origin;
  VVar2 = (button->super_UIComponent).super_Transformable.m_position;
  VVar3 = (button->super_UIComponent).super_Transformable.m_scale;
  *(undefined8 *)&(this->button).super_UIComponent.super_Transformable.m_position.y =
       *(undefined8 *)&(button->super_UIComponent).super_Transformable.m_position.y;
  (this->button).super_UIComponent.super_Transformable.m_scale = VVar3;
  (this->button).super_UIComponent.super_Transformable.m_origin = VVar1;
  (this->button).super_UIComponent.super_Transformable.m_position = VVar2;
  uVar4 = *(undefined8 *)((button->super_UIComponent).super_Transformable.m_transform.m_matrix + 2);
  uVar5 = *(undefined8 *)((button->super_UIComponent).super_Transformable.m_transform.m_matrix + 4);
  uVar6 = *(undefined8 *)((button->super_UIComponent).super_Transformable.m_transform.m_matrix + 6);
  uVar7 = *(undefined8 *)((button->super_UIComponent).super_Transformable.m_transform.m_matrix + 8);
  uVar8 = *(undefined8 *)((button->super_UIComponent).super_Transformable.m_transform.m_matrix + 10)
  ;
  uVar9 = *(undefined8 *)
           ((button->super_UIComponent).super_Transformable.m_transform.m_matrix + 0xc);
  uVar10 = *(undefined8 *)
            ((button->super_UIComponent).super_Transformable.m_transform.m_matrix + 0xe);
  *(undefined8 *)(this->button).super_UIComponent.super_Transformable.m_transform.m_matrix =
       *(undefined8 *)(button->super_UIComponent).super_Transformable.m_transform.m_matrix;
  *(undefined8 *)((this->button).super_UIComponent.super_Transformable.m_transform.m_matrix + 2) =
       uVar4;
  *(undefined8 *)((this->button).super_UIComponent.super_Transformable.m_transform.m_matrix + 4) =
       uVar5;
  *(undefined8 *)((this->button).super_UIComponent.super_Transformable.m_transform.m_matrix + 6) =
       uVar6;
  *(undefined8 *)((this->button).super_UIComponent.super_Transformable.m_transform.m_matrix + 8) =
       uVar7;
  *(undefined8 *)((this->button).super_UIComponent.super_Transformable.m_transform.m_matrix + 10) =
       uVar8;
  *(undefined8 *)((this->button).super_UIComponent.super_Transformable.m_transform.m_matrix + 0xc) =
       uVar9;
  *(undefined8 *)((this->button).super_UIComponent.super_Transformable.m_transform.m_matrix + 0xe) =
       uVar10;
  (this->button).super_UIComponent.super_Transformable.m_transformNeedUpdate =
       (button->super_UIComponent).super_Transformable.m_transformNeedUpdate;
  uVar4 = *(undefined8 *)(button->super_UIComponent).super_Transformable.m_inverseTransform.m_matrix
  ;
  uVar5 = *(undefined8 *)
           ((button->super_UIComponent).super_Transformable.m_inverseTransform.m_matrix + 2);
  uVar6 = *(undefined8 *)
           ((button->super_UIComponent).super_Transformable.m_inverseTransform.m_matrix + 6);
  uVar7 = *(undefined8 *)
           ((button->super_UIComponent).super_Transformable.m_inverseTransform.m_matrix + 8);
  uVar8 = *(undefined8 *)
           ((button->super_UIComponent).super_Transformable.m_inverseTransform.m_matrix + 10);
  uVar9 = *(undefined8 *)
           ((button->super_UIComponent).super_Transformable.m_inverseTransform.m_matrix + 0xc);
  uVar10 = *(undefined8 *)
            ((button->super_UIComponent).super_Transformable.m_inverseTransform.m_matrix + 0xe);
  *(undefined8 *)
   ((this->button).super_UIComponent.super_Transformable.m_inverseTransform.m_matrix + 4) =
       *(undefined8 *)
        ((button->super_UIComponent).super_Transformable.m_inverseTransform.m_matrix + 4);
  *(undefined8 *)
   ((this->button).super_UIComponent.super_Transformable.m_inverseTransform.m_matrix + 6) = uVar6;
  *(undefined8 *)
   ((this->button).super_UIComponent.super_Transformable.m_inverseTransform.m_matrix + 0xc) = uVar9;
  *(undefined8 *)
   ((this->button).super_UIComponent.super_Transformable.m_inverseTransform.m_matrix + 0xe) = uVar10
  ;
  *(undefined8 *)
   ((this->button).super_UIComponent.super_Transformable.m_inverseTransform.m_matrix + 8) = uVar7;
  *(undefined8 *)
   ((this->button).super_UIComponent.super_Transformable.m_inverseTransform.m_matrix + 10) = uVar8;
  *(undefined8 *)(this->button).super_UIComponent.super_Transformable.m_inverseTransform.m_matrix =
       uVar4;
  *(undefined8 *)
   ((this->button).super_UIComponent.super_Transformable.m_inverseTransform.m_matrix + 2) = uVar5;
  (this->button).super_UIComponent.super_Transformable.m_inverseTransformNeedUpdate =
       (button->super_UIComponent).super_Transformable.m_inverseTransformNeedUpdate;
  (this->button).super_UIComponent.super_Transformable.field_0xa9 =
       (button->super_UIComponent).super_Transformable.field_0xa9;
  VVar1 = (button->text).super_Transformable.m_origin;
  VVar2 = (button->text).super_Transformable.m_position;
  VVar3 = (button->text).super_Transformable.m_scale;
  *(undefined8 *)&(this->button).text.super_Transformable.m_position.y =
       *(undefined8 *)&(button->text).super_Transformable.m_position.y;
  (this->button).text.super_Transformable.m_scale = VVar3;
  (this->button).text.super_Transformable.m_origin = VVar1;
  (this->button).text.super_Transformable.m_position = VVar2;
  uVar4 = *(undefined8 *)((button->text).super_Transformable.m_transform.m_matrix + 2);
  uVar5 = *(undefined8 *)((button->text).super_Transformable.m_transform.m_matrix + 4);
  uVar6 = *(undefined8 *)((button->text).super_Transformable.m_transform.m_matrix + 6);
  uVar7 = *(undefined8 *)((button->text).super_Transformable.m_transform.m_matrix + 8);
  uVar8 = *(undefined8 *)((button->text).super_Transformable.m_transform.m_matrix + 10);
  uVar9 = *(undefined8 *)((button->text).super_Transformable.m_transform.m_matrix + 0xc);
  uVar10 = *(undefined8 *)((button->text).super_Transformable.m_transform.m_matrix + 0xe);
  *(undefined8 *)(this->button).text.super_Transformable.m_transform.m_matrix =
       *(undefined8 *)(button->text).super_Transformable.m_transform.m_matrix;
  *(undefined8 *)((this->button).text.super_Transformable.m_transform.m_matrix + 2) = uVar4;
  *(undefined8 *)((this->button).text.super_Transformable.m_transform.m_matrix + 4) = uVar5;
  *(undefined8 *)((this->button).text.super_Transformable.m_transform.m_matrix + 6) = uVar6;
  *(undefined8 *)((this->button).text.super_Transformable.m_transform.m_matrix + 8) = uVar7;
  *(undefined8 *)((this->button).text.super_Transformable.m_transform.m_matrix + 10) = uVar8;
  *(undefined8 *)((this->button).text.super_Transformable.m_transform.m_matrix + 0xc) = uVar9;
  *(undefined8 *)((this->button).text.super_Transformable.m_transform.m_matrix + 0xe) = uVar10;
  (this->button).text.super_Transformable.m_transformNeedUpdate =
       (button->text).super_Transformable.m_transformNeedUpdate;
  uVar4 = *(undefined8 *)(button->text).super_Transformable.m_inverseTransform.m_matrix;
  uVar5 = *(undefined8 *)((button->text).super_Transformable.m_inverseTransform.m_matrix + 2);
  uVar6 = *(undefined8 *)((button->text).super_Transformable.m_inverseTransform.m_matrix + 6);
  uVar7 = *(undefined8 *)((button->text).super_Transformable.m_inverseTransform.m_matrix + 8);
  uVar8 = *(undefined8 *)((button->text).super_Transformable.m_inverseTransform.m_matrix + 10);
  uVar9 = *(undefined8 *)((button->text).super_Transformable.m_inverseTransform.m_matrix + 0xc);
  uVar10 = *(undefined8 *)((button->text).super_Transformable.m_inverseTransform.m_matrix + 0xe);
  *(undefined8 *)((this->button).text.super_Transformable.m_inverseTransform.m_matrix + 4) =
       *(undefined8 *)((button->text).super_Transformable.m_inverseTransform.m_matrix + 4);
  *(undefined8 *)((this->button).text.super_Transformable.m_inverseTransform.m_matrix + 6) = uVar6;
  *(undefined8 *)((this->button).text.super_Transformable.m_inverseTransform.m_matrix + 0xc) = uVar9
  ;
  *(undefined8 *)((this->button).text.super_Transformable.m_inverseTransform.m_matrix + 0xe) =
       uVar10;
  *(undefined8 *)((this->button).text.super_Transformable.m_inverseTransform.m_matrix + 8) = uVar7;
  *(undefined8 *)((this->button).text.super_Transformable.m_inverseTransform.m_matrix + 10) = uVar8;
  *(undefined8 *)(this->button).text.super_Transformable.m_inverseTransform.m_matrix = uVar4;
  *(undefined8 *)((this->button).text.super_Transformable.m_inverseTransform.m_matrix + 2) = uVar5;
  (this->button).text.super_Transformable.m_inverseTransformNeedUpdate =
       (button->text).super_Transformable.m_inverseTransformNeedUpdate;
  sf::String::operator=(&(this->button).text.m_string,&(button->text).m_string);
  (this->button).text.m_outlineThickness = (button->text).m_outlineThickness;
  pFVar11 = (button->text).m_font;
  uVar16 = (button->text).m_characterSize;
  fVar17 = (button->text).m_letterSpacingFactor;
  UVar13 = (button->text).m_style;
  CVar14 = (button->text).m_fillColor;
  CVar15 = (button->text).m_outlineColor;
  (this->button).text.m_lineSpacingFactor = (button->text).m_lineSpacingFactor;
  (this->button).text.m_style = UVar13;
  (this->button).text.m_fillColor = CVar14;
  (this->button).text.m_outlineColor = CVar15;
  (this->button).text.m_font = pFVar11;
  (this->button).text.m_characterSize = uVar16;
  (this->button).text.m_letterSpacingFactor = fVar17;
  std::vector<sf::Vertex,_std::allocator<sf::Vertex>_>::operator=
            (&(this->button).text.m_vertices.m_vertices,&(button->text).m_vertices.m_vertices);
  (this->button).text.m_vertices.m_primitiveType = (button->text).m_vertices.m_primitiveType;
  std::vector<sf::Vertex,_std::allocator<sf::Vertex>_>::operator=
            (&(this->button).text.m_outlineVertices.m_vertices,
             &(button->text).m_outlineVertices.m_vertices);
  (this->button).text.m_outlineVertices.m_primitiveType =
       (button->text).m_outlineVertices.m_primitiveType;
  fVar17 = (button->text).m_bounds.top;
  fVar18 = (button->text).m_bounds.width;
  fVar19 = (button->text).m_bounds.height;
  (this->button).text.m_bounds.left = (button->text).m_bounds.left;
  (this->button).text.m_bounds.top = fVar17;
  (this->button).text.m_bounds.width = fVar18;
  (this->button).text.m_bounds.height = fVar19;
  uVar20 = *(undefined7 *)&(button->text).field_0x161;
  UVar12 = (button->text).m_fontTextureId;
  (this->button).text.m_geometryNeedUpdate = (button->text).m_geometryNeedUpdate;
  *(undefined7 *)&(this->button).text.field_0x161 = uVar20;
  (this->button).text.m_fontTextureId = UVar12;
  VVar1 = (button->button).super_Shape.super_Transformable.m_origin;
  VVar2 = (button->button).super_Shape.super_Transformable.m_position;
  VVar3 = (button->button).super_Shape.super_Transformable.m_scale;
  *(undefined8 *)&(this->button).button.super_Shape.super_Transformable.m_position.y =
       *(undefined8 *)&(button->button).super_Shape.super_Transformable.m_position.y;
  (this->button).button.super_Shape.super_Transformable.m_scale = VVar3;
  (this->button).button.super_Shape.super_Transformable.m_origin = VVar1;
  (this->button).button.super_Shape.super_Transformable.m_position = VVar2;
  uVar4 = *(undefined8 *)((button->button).super_Shape.super_Transformable.m_transform.m_matrix + 2)
  ;
  uVar5 = *(undefined8 *)((button->button).super_Shape.super_Transformable.m_transform.m_matrix + 4)
  ;
  uVar6 = *(undefined8 *)((button->button).super_Shape.super_Transformable.m_transform.m_matrix + 6)
  ;
  uVar7 = *(undefined8 *)((button->button).super_Shape.super_Transformable.m_transform.m_matrix + 8)
  ;
  uVar8 = *(undefined8 *)
           ((button->button).super_Shape.super_Transformable.m_transform.m_matrix + 10);
  uVar9 = *(undefined8 *)
           ((button->button).super_Shape.super_Transformable.m_transform.m_matrix + 0xc);
  uVar10 = *(undefined8 *)
            ((button->button).super_Shape.super_Transformable.m_transform.m_matrix + 0xe);
  *(undefined8 *)(this->button).button.super_Shape.super_Transformable.m_transform.m_matrix =
       *(undefined8 *)(button->button).super_Shape.super_Transformable.m_transform.m_matrix;
  *(undefined8 *)((this->button).button.super_Shape.super_Transformable.m_transform.m_matrix + 2) =
       uVar4;
  *(undefined8 *)((this->button).button.super_Shape.super_Transformable.m_transform.m_matrix + 4) =
       uVar5;
  *(undefined8 *)((this->button).button.super_Shape.super_Transformable.m_transform.m_matrix + 6) =
       uVar6;
  *(undefined8 *)((this->button).button.super_Shape.super_Transformable.m_transform.m_matrix + 8) =
       uVar7;
  *(undefined8 *)((this->button).button.super_Shape.super_Transformable.m_transform.m_matrix + 10) =
       uVar8;
  *(undefined8 *)((this->button).button.super_Shape.super_Transformable.m_transform.m_matrix + 0xc)
       = uVar9;
  *(undefined8 *)((this->button).button.super_Shape.super_Transformable.m_transform.m_matrix + 0xe)
       = uVar10;
  (this->button).button.super_Shape.super_Transformable.m_transformNeedUpdate =
       (button->button).super_Shape.super_Transformable.m_transformNeedUpdate;
  uVar4 = *(undefined8 *)
           (button->button).super_Shape.super_Transformable.m_inverseTransform.m_matrix;
  uVar5 = *(undefined8 *)
           ((button->button).super_Shape.super_Transformable.m_inverseTransform.m_matrix + 2);
  uVar6 = *(undefined8 *)
           ((button->button).super_Shape.super_Transformable.m_inverseTransform.m_matrix + 6);
  uVar7 = *(undefined8 *)
           ((button->button).super_Shape.super_Transformable.m_inverseTransform.m_matrix + 8);
  uVar8 = *(undefined8 *)
           ((button->button).super_Shape.super_Transformable.m_inverseTransform.m_matrix + 10);
  uVar9 = *(undefined8 *)
           ((button->button).super_Shape.super_Transformable.m_inverseTransform.m_matrix + 0xc);
  uVar10 = *(undefined8 *)
            ((button->button).super_Shape.super_Transformable.m_inverseTransform.m_matrix + 0xe);
  *(undefined8 *)
   ((this->button).button.super_Shape.super_Transformable.m_inverseTransform.m_matrix + 4) =
       *(undefined8 *)
        ((button->button).super_Shape.super_Transformable.m_inverseTransform.m_matrix + 4);
  *(undefined8 *)
   ((this->button).button.super_Shape.super_Transformable.m_inverseTransform.m_matrix + 6) = uVar6;
  *(undefined8 *)
   ((this->button).button.super_Shape.super_Transformable.m_inverseTransform.m_matrix + 8) = uVar7;
  *(undefined8 *)
   ((this->button).button.super_Shape.super_Transformable.m_inverseTransform.m_matrix + 10) = uVar8;
  *(undefined8 *)
   ((this->button).button.super_Shape.super_Transformable.m_inverseTransform.m_matrix + 0xc) = uVar9
  ;
  *(undefined8 *)
   ((this->button).button.super_Shape.super_Transformable.m_inverseTransform.m_matrix + 0xe) =
       uVar10;
  *(undefined8 *)(this->button).button.super_Shape.super_Transformable.m_inverseTransform.m_matrix =
       uVar4;
  *(undefined8 *)
   ((this->button).button.super_Shape.super_Transformable.m_inverseTransform.m_matrix + 2) = uVar5;
  (this->button).button.super_Shape.super_Transformable.m_inverseTransformNeedUpdate =
       (button->button).super_Shape.super_Transformable.m_inverseTransformNeedUpdate;
  iVar21 = (button->button).super_Shape.m_textureRect.left;
  iVar22 = (button->button).super_Shape.m_textureRect.top;
  iVar23 = (button->button).super_Shape.m_textureRect.width;
  iVar24 = (button->button).super_Shape.m_textureRect.height;
  CVar14 = (button->button).super_Shape.m_fillColor;
  CVar15 = (button->button).super_Shape.m_outlineColor;
  (this->button).button.super_Shape.m_texture = (button->button).super_Shape.m_texture;
  (this->button).button.super_Shape.m_textureRect.left = iVar21;
  (this->button).button.super_Shape.m_textureRect.top = iVar22;
  (this->button).button.super_Shape.m_outlineThickness =
       (button->button).super_Shape.m_outlineThickness;
  (this->button).button.super_Shape.m_textureRect.width = iVar23;
  (this->button).button.super_Shape.m_textureRect.height = iVar24;
  (this->button).button.super_Shape.m_fillColor = CVar14;
  (this->button).button.super_Shape.m_outlineColor = CVar15;
  std::vector<sf::Vertex,_std::allocator<sf::Vertex>_>::operator=
            (&(this->button).button.super_Shape.m_vertices.m_vertices,
             &(button->button).super_Shape.m_vertices.m_vertices);
  (this->button).button.super_Shape.m_vertices.m_primitiveType =
       (button->button).super_Shape.m_vertices.m_primitiveType;
  std::vector<sf::Vertex,_std::allocator<sf::Vertex>_>::operator=
            (&(this->button).button.super_Shape.m_outlineVertices.m_vertices,
             &(button->button).super_Shape.m_outlineVertices.m_vertices);
  (this->button).button.super_Shape.m_outlineVertices.m_primitiveType =
       (button->button).super_Shape.m_outlineVertices.m_primitiveType;
  fVar17 = (button->button).super_Shape.m_insideBounds.top;
  fVar18 = (button->button).super_Shape.m_insideBounds.width;
  fVar19 = (button->button).super_Shape.m_insideBounds.height;
  fVar25 = (button->button).super_Shape.m_bounds.left;
  fVar26 = (button->button).super_Shape.m_bounds.top;
  fVar27 = (button->button).super_Shape.m_bounds.width;
  fVar28 = (button->button).super_Shape.m_bounds.height;
  (this->button).button.super_Shape.m_insideBounds.left =
       (button->button).super_Shape.m_insideBounds.left;
  (this->button).button.super_Shape.m_insideBounds.top = fVar17;
  (this->button).button.super_Shape.m_insideBounds.width = fVar18;
  (this->button).button.super_Shape.m_insideBounds.height = fVar19;
  (this->button).button.super_Shape.m_bounds.left = fVar25;
  (this->button).button.super_Shape.m_bounds.top = fVar26;
  (this->button).button.super_Shape.m_bounds.width = fVar27;
  (this->button).button.super_Shape.m_bounds.height = fVar28;
  (this->button).button.m_size = (button->button).m_size;
  CVar14 = button->color2;
  (this->button).color1 = button->color1;
  (this->button).color2 = CVar14;
  std::function<void_(int)>::operator=(&(this->button).action,&button->action);
  (this->button).selected = button->selected;
  (this->button).actionOption = button->actionOption;
  local_38.x = 0.0;
  local_38.y = 4.0;
  sf::RectangleShape::setSize(this_01,&local_38);
  sf::Shape::setFillColor(&this_01->super_Shape,backgroundColor);
  pVVar29 = sf::RectangleShape::getSize(&button->button);
  sf::Transformable::setPosition(&(this->background).super_Shape.super_Transformable,0.0,pVVar29->y)
  ;
  pVVar29 = sf::Transformable::getPosition(&(button->super_UIComponent).super_Transformable);
  sf::Transformable::setPosition(this_00,pVVar29);
  sf::Transformable::setPosition(&(this->button).super_UIComponent.super_Transformable,0.0,0.0);
  this->maxMenuButtonWidth = 0.0;
  (this->super_UIComponent).super_Transformable.field_0xa9 = 0;
  return;
}

Assistant:

DropdownMenu::DropdownMenu(const TextButton& button, const Color& backgroundColor) {
    this->button = button;
    
    background.setSize(Vector2f(0.0f, 4.0f));
    background.setFillColor(backgroundColor);
    background.setPosition(0.0f, button.button.getSize().y);
    
    setPosition(button.getPosition());
    this->button.setPosition(0.0f, 0.0f);
    maxMenuButtonWidth = 0.0f;
    visible = false;
}